

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

void LowererMD::GenerateDebugBreak(Instr *insertInstr)

{
  Instr *this;
  IntConstOpnd *newSrc;
  Instr *int3;
  Instr *insertInstr_local;
  
  this = IR::Instr::New(INT,insertInstr->m_func);
  newSrc = IR::IntConstOpnd::New(3,TyInt32,insertInstr->m_func,false);
  IR::Instr::SetSrc1(this,&newSrc->super_Opnd);
  IR::Instr::InsertBefore(insertInstr,this);
  return;
}

Assistant:

void LowererMD::GenerateDebugBreak( IR::Instr * insertInstr )
{
    // int 3

    IR::Instr *int3 = IR::Instr::New(Js::OpCode::INT, insertInstr->m_func);
    int3->SetSrc1(IR::IntConstOpnd::New(3, TyInt32, insertInstr->m_func));
    insertInstr->InsertBefore(int3);
}